

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O1

atomBins *
binAtoms(atom *theAtoms,region *boundingBox,char serialNum,float probeRad,int keepUnselected,
        int selflags)

{
  atomBins *bins;
  float fVar1;
  
  fVar1 = getMaxRadius((uint)ImplicitH);
  bins = initBins(serialNum,boundingBox,fVar1 + probeRad + fVar1 + probeRad + 0.2);
  if (theAtoms != (atom *)0x0 && bins != (atomBins *)0x0) {
    do {
      if (((keepUnselected != 0) || ((theAtoms->flags & selflags) != 0)) &&
         ((theAtoms->flags & 4) == 0)) {
        addNeighbor(theAtoms,bins);
      }
      theAtoms = theAtoms->next;
    } while (theAtoms != (atom_t *)0x0);
  }
  return bins;
}

Assistant:

atomBins* binAtoms(atom *theAtoms, region *boundingBox, char serialNum,
		  float probeRad, int keepUnselected, int selflags)
{
   atom *a = NULL;
   atomBins *bins = NULL;

   bins = initBins(serialNum, boundingBox,
	    2.0f*(getMaxRadius(ImplicitH)+probeRad)+0.2f);
   if (bins) {
      for(a = theAtoms; a; a = a->next) {
	 if (keepUnselected || (a->flags & selflags)) {
	    if (! (a->flags & IGNORE_FLAG)) {
	       addNeighbor(a, bins);
	    }
            /*050118 this seems the only place that uses IGNORE_FLAG*/
	 }
      }
   }
   /* note: addNeighbor() also called in updateHydrogenInfo() */
   return bins;
}